

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::X<Fad<double>>
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *xi,TPZVec<Fad<double>_> *result)

{
  double *pdVar1;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *pTVar2;
  bool bVar3;
  MElementType elType;
  uint uVar4;
  int iVar5;
  double *pdVar6;
  Fad<double> *pFVar7;
  Fad<double> *this_00;
  int iNode;
  long lVar8;
  int x_1;
  int x;
  long lVar9;
  long lVar10;
  int x_2;
  ulong row;
  long lVar11;
  int side_1;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *local_18a8;
  Fad<double> *local_18a0;
  int subSide;
  TPZVec<Fad<double>_> *local_1890;
  TPZGeoMesh *local_1888;
  Fad<double> blendFactorSide;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_1840;
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
  local_1830;
  TPZGeoElSide gelside;
  TPZManVector<bool,_20> isRegularMapping;
  TPZManVector<Fad<double>,_3> projectedPoint;
  TPZManVector<double,_3> nodeCoord;
  TPZStack<int,_10> allContainedSides;
  TPZManVector<Fad<double>,_3> neighXi_1;
  TPZStack<int,_10> containedNodesInSide;
  TPZGeoElSide neighbour;
  TPZManVector<Fad<double>,_3> Xside;
  TPZManVector<Fad<double>,_3> notUsedHereVec;
  TPZManVector<Fad<double>,_3> sideXi;
  TPZFNMatrix<27,_Fad<double>_> projectedPointOverSide;
  TPZFNMatrix<9,_Fad<double>_> sidePhi;
  TPZFNMatrix<9,_Fad<double>_> notUsedHereMat;
  TPZFNMatrix<9,_Fad<double>_> phi;
  TPZFNMatrix<27,_Fad<double>_> linearSideMappings;
  TPZFNMatrix<27,_Fad<double>_> nonLinearSideMappings;
  TPZManVector<Fad<double>,_20> blendFactor;
  
  local_18a8 = this;
  local_1890 = xi;
  if (this->fGeoEl == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1f6);
  }
  local_1888 = this->fGeoEl->fMesh;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fRow =
       projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
       super_TPZBaseMatrix.fRow & 0xffffffff00000000;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fCol = 0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDefPositive = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix._26_6_ = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector
            (&notUsedHereVec,3,(Fad<double> *)&projectedPointOverSide);
  Fad<double>::~Fad((Fad<double> *)&projectedPointOverSide);
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fRow =
       projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
       super_TPZBaseMatrix.fRow & 0xffffffff00000000;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fCol = 0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDefPositive = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix._26_6_ = 0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (&notUsedHereMat,7,7,(Fad<double> *)&projectedPointOverSide);
  Fad<double>::~Fad((Fad<double> *)&projectedPointOverSide);
  (*result->_vptr_TPZVec[3])(result,3);
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fRow =
       projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
       super_TPZBaseMatrix.fRow & 0xffffffff00000000;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fCol = 0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDefPositive = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix._26_6_ = 0;
  TPZVec<Fad<double>_>::Fill(result,(Fad<double> *)&projectedPointOverSide,0,-1);
  Fad<double>::~Fad((Fad<double> *)&projectedPointOverSide);
  if (local_18a8->fNeighbours[3].fGeoElIndex == -1) {
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&phi,3,1);
    pztopology::TPZTriangle::TShape<Fad<double>>
              (local_1890,&phi.super_TPZFMatrix<Fad<double>_>,
               &notUsedHereMat.super_TPZFMatrix<Fad<double>_>);
    pTVar2 = local_18a8;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      lVar10 = 0;
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        pdVar6 = TPZFMatrix<double>::operator()(coord,lVar9,lVar8);
        local_18a0 = (Fad<double> *)*pdVar6;
        projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
        super_TPZBaseMatrix._24_8_ =
             TPZFMatrix<Fad<double>_>::operator()(&phi.super_TPZFMatrix<Fad<double>_>,lVar8,0);
        projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
        super_TPZBaseMatrix.fRow = (int64_t)local_18a0;
        projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
        super_TPZBaseMatrix.fCol = 0;
        Fad<double>::operator+=
                  ((Fad<double> *)((long)&result->fStore->val_ + lVar10),
                   (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&projectedPointOverSide);
        lVar10 = lVar10 + 0x20;
      }
    }
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable & 0xffffffffffffff00;
    TPZManVector<bool,_20>::TPZManVector(&isRegularMapping,4,(bool *)&projectedPointOverSide);
    for (lVar8 = -3; lVar8 != 0; lVar8 = lVar8 + 1) {
      projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_ = (int)lVar8 + 6;
      bVar3 = pztopology::TPZTriangle::CheckProjectionForSingularity<Fad<double>>
                        ((int *)&projectedPointOverSide,local_1890);
      isRegularMapping.super_TPZVec<bool>.fStore[lVar8 + 3] = bVar3;
    }
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow =
         projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fRow & 0xffffffff00000000;
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZManVector<Fad<double>,_20>::TPZManVector
              (&blendFactor,4,(Fad<double> *)&projectedPointOverSide);
    Fad<double>::~Fad((Fad<double> *)&projectedPointOverSide);
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&projectedPointOverSide,4,2,(Fad<double> *)&linearSideMappings);
    Fad<double>::~Fad((Fad<double> *)&linearSideMappings);
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&linearSideMappings,4,3,(Fad<double> *)&nonLinearSideMappings);
    Fad<double>::~Fad((Fad<double> *)&nonLinearSideMappings);
    sidePhi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    sidePhi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow.
    _0_4_ = 0;
    sidePhi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol =
         0;
    sidePhi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    sidePhi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    sidePhi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_
         = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix(&nonLinearSideMappings,4,3,(Fad<double> *)&sidePhi);
    Fad<double>::~Fad((Fad<double> *)&sidePhi);
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      side_1 = (int)lVar8 + 3;
      if (isRegularMapping.super_TPZVec<bool>.fStore[lVar8] == true) {
        TPZGeoElSide::TPZGeoElSide(&gelside,pTVar2->fNeighbours + lVar8,local_1888);
        bVar3 = IsLinearMapping(local_18a8,side_1);
        if (((bVar3) || (gelside.fGeoEl == (TPZGeoEl *)0x0)) || (gelside.fSide < 0)) {
          sidePhi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable =
               sidePhi.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
               super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable & 0xffffffff00000000;
          Fad<double>::operator=<int,_nullptr>
                    (blendFactor.super_TPZVec<Fad<double>_>.fStore + lVar8,(int *)&sidePhi);
        }
        else {
          TPZManVector<Fad<double>,_3>::TPZManVector(&sideXi,0);
          pztopology::TPZTriangle::MapToSide<Fad<double>>
                    (side_1,local_1890,&sideXi.super_TPZVec<Fad<double>_>,
                     &notUsedHereMat.super_TPZFMatrix<Fad<double>_>);
          elType = pztopology::TPZTriangle::Type(side_1);
          uVar4 = MElementType_NNodes(elType);
          TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&sidePhi,(long)(int)uVar4,1);
          TPZFMatrix<Fad<double>_>::Resize
                    (&notUsedHereMat.super_TPZFMatrix<Fad<double>_>,2,(long)(int)uVar4);
          GetSideShapeFunction<pzgeom::TPZGeoTriangle>
                    (side_1,&sideXi.super_TPZVec<Fad<double>_>,
                     &sidePhi.super_TPZFMatrix<Fad<double>_>,
                     &notUsedHereMat.super_TPZFMatrix<Fad<double>_>);
          TPZManVector<double,_3>::TPZManVector(&nodeCoord,0);
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          for (row = 0; row != uVar4; row = row + 1) {
            iVar5 = pztopology::TPZTriangle::SideNodeLocId(side_1,(int)row);
            for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
              pdVar6 = TPZFMatrix<double>::operator()(coord,lVar9,(long)iVar5);
              local_18a0 = (Fad<double> *)*pdVar6;
              neighXi_1.super_TPZVec<Fad<double>_>.fNAlloc =
                   (int64_t)TPZFMatrix<Fad<double>_>::operator()
                                      (&sidePhi.super_TPZFMatrix<Fad<double>_>,row,0);
              neighXi_1.super_TPZVec<Fad<double>_>.fStore = local_18a0;
              neighXi_1.super_TPZVec<Fad<double>_>.fNElements = 0;
              pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                 (&linearSideMappings.super_TPZFMatrix<Fad<double>_>,lVar8,lVar9);
              Fad<double>::operator+=
                        (pFVar7,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&neighXi_1);
            }
            pztopology::TPZTriangle::ParametricDomainNodeCoord
                      (iVar5,&nodeCoord.super_TPZVec<double>);
            for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
              local_18a0 = (Fad<double> *)nodeCoord.super_TPZVec<double>.fStore[lVar9];
              neighXi_1.super_TPZVec<Fad<double>_>.fNAlloc =
                   (int64_t)TPZFMatrix<Fad<double>_>::operator()
                                      (&sidePhi.super_TPZFMatrix<Fad<double>_>,row,0);
              neighXi_1.super_TPZVec<Fad<double>_>.fStore = local_18a0;
              neighXi_1.super_TPZVec<Fad<double>_>.fNElements = 0;
              pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                 (&projectedPointOverSide.super_TPZFMatrix<Fad<double>_>,lVar8,lVar9
                                 );
              Fad<double>::operator+=
                        (pFVar7,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&neighXi_1);
            }
          }
          local_18a0 = (Fad<double> *)(lVar8 * 0x20);
          pztopology::TPZTriangle::BlendFactorForSide<Fad<double>>
                    (&side_1,local_1890,blendFactor.super_TPZVec<Fad<double>_>.fStore + lVar8,
                     &notUsedHereVec.super_TPZVec<Fad<double>_>);
          iVar5 = TPZGeoElSide::Dimension(&gelside);
          TPZManVector<Fad<double>,_3>::TPZManVector(&neighXi_1,0);
          bVar3 = MapToNeighSide<Fad<double>>
                            (local_18a8,side_1,iVar5,local_1890,
                             &neighXi_1.super_TPZVec<Fad<double>_>,
                             &notUsedHereMat.super_TPZFMatrix<Fad<double>_>);
          if (bVar3) {
            projectedPoint.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
            projectedPoint.super_TPZVec<Fad<double>_>.fStore =
                 (Fad<double> *)
                 ((ulong)projectedPoint.super_TPZVec<Fad<double>_>.fStore & 0xffffffff00000000);
            projectedPoint.super_TPZVec<Fad<double>_>.fNElements = 0;
            projectedPoint.super_TPZVec<Fad<double>_>.fNAlloc = 0;
            TPZManVector<Fad<double>,_3>::TPZManVector(&Xside,3,(Fad<double> *)&projectedPoint);
            Fad<double>::~Fad((Fad<double> *)&projectedPoint);
            Neighbour(&neighbour,local_18a8,side_1,local_1888);
            TPZGeoElSide::X(&neighbour,&neighXi_1.super_TPZVec<Fad<double>_>,
                            &Xside.super_TPZVec<Fad<double>_>);
            lVar9 = 0;
            for (lVar10 = 0; pFVar7 = Xside.super_TPZVec<Fad<double>_>.fStore, lVar10 != 3;
                lVar10 = lVar10 + 1) {
              this_00 = TPZFMatrix<Fad<double>_>::operator()
                                  (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,lVar8,
                                   lVar10);
              Fad<double>::operator=(this_00,(Fad<double> *)((long)&pFVar7->val_ + lVar9));
              lVar9 = lVar9 + 0x20;
            }
            TPZStack<int,_10>::TPZStack(&containedNodesInSide);
            pztopology::TPZTriangle::LowerDimensionSides(side_1,&containedNodesInSide,0);
            TPZStack<int,_10>::TPZStack(&allContainedSides);
            pztopology::TPZTriangle::LowerDimensionSides(side_1,&allContainedSides);
            for (lVar9 = (long)(int)containedNodesInSide.super_TPZManVector<int,_10>.
                                    super_TPZVec<int>.fNElements;
                lVar9 < allContainedSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
                lVar9 = lVar9 + 1) {
              subSide = allContainedSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore
                        [lVar9];
              if (isRegularMapping.super_TPZVec<bool>.fStore[(long)subSide + -3] != false) {
                bVar3 = IsLinearMapping(local_18a8,subSide);
                if (!bVar3) {
                  blendFactorSide.val_ = -1.0;
                  blendFactorSide.dx_._0_8_ = blendFactorSide.dx_._0_8_ & 0xffffffff00000000;
                  blendFactorSide.dx_.ptr_to_data = (double *)0x0;
                  blendFactorSide.defaultVal = 0.0;
                  TPZManVector<Fad<double>,_3>::TPZManVector(&projectedPoint,2,&blendFactorSide);
                  Fad<double>::~Fad(&blendFactorSide);
                  lVar11 = 0;
                  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                    pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                       (&projectedPointOverSide.super_TPZFMatrix<Fad<double>_>,lVar8
                                        ,lVar10);
                    Fad<double>::operator=
                              ((Fad<double> *)
                               ((long)&(projectedPoint.super_TPZVec<Fad<double>_>.fStore)->val_ +
                               lVar11),pFVar7);
                    lVar11 = lVar11 + 0x20;
                  }
                  blendFactorSide.val_ = -1.0;
                  blendFactorSide.dx_._0_8_ = blendFactorSide.dx_._0_8_ & 0xffffffff00000000;
                  blendFactorSide.dx_.ptr_to_data = (double *)0x0;
                  blendFactorSide.defaultVal = 0.0;
                  pztopology::TPZTriangle::BlendFactorForSide<Fad<double>>
                            (&subSide,&projectedPoint.super_TPZVec<Fad<double>_>,&blendFactorSide,
                             &notUsedHereVec.super_TPZVec<Fad<double>_>);
                  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                    pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                       (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,
                                        (long)subSide + -3,lVar10);
                    local_1840.fadexpr_.right_ =
                         TPZFMatrix<Fad<double>_>::operator()
                                   (&linearSideMappings.super_TPZFMatrix<Fad<double>_>,
                                    (long)subSide + -3,lVar10);
                    local_1830.fadexpr_.left_ = &blendFactorSide;
                    local_1830.fadexpr_.right_ = &local_1840;
                    local_1840.fadexpr_.left_ = pFVar7;
                    pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                       (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,lVar8,
                                        lVar10);
                    Fad<double>::operator-=(pFVar7,&local_1830);
                  }
                  Fad<double>::~Fad(&blendFactorSide);
                  TPZManVector<Fad<double>,_3>::~TPZManVector(&projectedPoint);
                }
              }
            }
            lVar9 = 0;
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              pdVar6 = &(blendFactor.super_TPZVec<Fad<double>_>.fStore)->val_;
              pdVar1 = &local_18a0->val_;
              pFVar7 = TPZFMatrix<Fad<double>_>::operator()
                                 (&nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>,lVar8,lVar10
                                 );
              blendFactorSide.dx_._0_8_ =
                   TPZFMatrix<Fad<double>_>::operator()
                             (&linearSideMappings.super_TPZFMatrix<Fad<double>_>,lVar8,lVar10);
              projectedPoint.super_TPZVec<Fad<double>_>.fStore = &blendFactorSide;
              blendFactorSide.val_ = (double)pFVar7;
              projectedPoint.super_TPZVec<Fad<double>_>._vptr_TPZVec =
                   (_func_int **)((long)pdVar1 + (long)pdVar6);
              Fad<double>::operator+=
                        ((Fad<double> *)((long)&result->fStore->val_ + lVar9),
                         (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                          *)&projectedPoint);
              lVar9 = lVar9 + 0x20;
            }
            TPZManVector<int,_10>::~TPZManVector(&allContainedSides.super_TPZManVector<int,_10>);
            TPZManVector<int,_10>::~TPZManVector(&containedNodesInSide.super_TPZManVector<int,_10>);
            TPZManVector<Fad<double>,_3>::~TPZManVector(&Xside);
          }
          TPZManVector<Fad<double>,_3>::~TPZManVector(&neighXi_1);
          TPZManVector<double,_3>::~TPZManVector(&nodeCoord);
          TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&sidePhi);
          TPZManVector<Fad<double>,_3>::~TPZManVector(&sideXi);
        }
      }
    }
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&nonLinearSideMappings);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&linearSideMappings);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&projectedPointOverSide);
    TPZManVector<Fad<double>,_20>::~TPZManVector(&blendFactor);
    TPZManVector<bool,_20>::~TPZManVector(&isRegularMapping);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&phi);
  }
  else {
    TPZManVector<Fad<double>,_3>::TPZManVector
              ((TPZManVector<Fad<double>,_3> *)&projectedPointOverSide,0);
    bVar3 = MapToNeighSide<Fad<double>>
                      (local_18a8,6,2,local_1890,(TPZVec<Fad<double>_> *)&projectedPointOverSide,
                       &notUsedHereMat.super_TPZFMatrix<Fad<double>_>);
    if (!bVar3) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x215);
    }
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)&linearSideMappings,local_18a8->fNeighbours + 3,local_1888);
    TPZGeoElSide::X((TPZGeoElSide *)&linearSideMappings,
                    (TPZVec<Fad<double>_> *)&projectedPointOverSide,result);
    TPZManVector<Fad<double>,_3>::~TPZManVector
              ((TPZManVector<Fad<double>,_3> *)&projectedPointOverSide);
  }
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&notUsedHereMat);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&notUsedHereVec);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}